

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_gen_joliet_identifier(archive_write *a,isoent *isoent,idr *idr)

{
  void *pvVar1;
  int iVar2;
  wchar_t wVar3;
  int *piVar4;
  char *pcVar5;
  size_t local_78;
  size_t lt;
  int local_68;
  int weight;
  int noff;
  int ext_off;
  uchar *dot;
  int local_50;
  int parent_len;
  int ffmax;
  int r;
  size_t l;
  uchar *p;
  isoent *np;
  iso9660_conflict *iso9660;
  idr *idr_local;
  isoent *isoent_local;
  archive_write *a_local;
  
  if ((isoent->children).cnt == 0) {
    a_local._4_4_ = 0;
  }
  else {
    pvVar1 = a->format_data;
    if ((*(uint *)((long)pvVar1 + 0x10370) >> 0x11 & 3) == 2) {
      local_50 = 0xce;
    }
    else {
      local_50 = 0x80;
    }
    a_local._4_4_ =
         idr_start(a,idr,(isoent->children).cnt,local_50,6,2,&isoent_gen_joliet_identifier::rb_ops);
    if (-1 < a_local._4_4_) {
      dot._4_4_ = 1;
      for (p = (uchar *)isoent; *(uchar **)(p + 0x20) != p; p = *(uchar **)(p + 0x20)) {
        dot._4_4_ = *(int *)(p + 0xbc) + 1 + dot._4_4_;
      }
      for (p = (uchar *)(isoent->children).first; p != (uchar *)0x0; p = *(uchar **)(p + 0x70)) {
        _ffmax = *(size_t *)(*(long *)(p + 0x18) + 0x60);
        if (local_50 < (int)_ffmax) {
          _ffmax = (size_t)local_50;
        }
        l = (size_t)malloc((_ffmax + 1) * 2);
        if ((void *)l == (void *)0x0) {
          archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
          return -0x1e;
        }
        memcpy((void *)l,*(void **)(*(long *)(p + 0x18) + 0x58),_ffmax);
        *(undefined1 *)(l + _ffmax) = 0;
        *(undefined1 *)(l + _ffmax + 1) = 0;
        *(size_t *)(p + 0xa8) = l;
        _noff = l + _ffmax;
        lt._4_4_ = 0;
        for (local_78 = _ffmax; local_78 != 0; local_78 = local_78 - 2) {
          iVar2 = joliet_allowed_char(*(uchar *)l,*(uchar *)(l + 1));
          if (iVar2 == 0) {
            archive_be16enc((void *)l,0x5f);
          }
          else if ((*(char *)l == '\0') && (*(char *)(l + 1) == '.')) {
            _noff = l;
          }
          l = l + 2;
        }
        local_68 = (int)_noff - (int)*(undefined8 *)(p + 0xa8);
        *(int *)(p + 0xb0) = local_68;
        iVar2 = (int)_ffmax;
        *(int *)(p + 0xb4) = iVar2 - local_68;
        *(int *)(p + 0xb8) = iVar2;
        if (local_50 < (int)*(undefined8 *)(*(long *)(p + 0x18) + 0x60)) {
          wVar3 = archive_strncpy_l((archive_string *)((long)pvVar1 + 0x60),*(void **)(p + 0xa8),
                                    _ffmax,*(archive_string_conv **)((long)pvVar1 + 0x80));
          if ((wVar3 != L'\0') && (piVar4 = __errno_location(), *piVar4 == 0xc)) {
            piVar4 = __errno_location();
            archive_set_error(&a->archive,*piVar4,"No memory");
            return -0x1e;
          }
          *(int *)(p + 0xbc) = (int)*(undefined8 *)((long)pvVar1 + 0x68);
          if (*(int *)(p + 0xbc) != (int)*(undefined8 *)(*(long *)(p + 0x18) + 0x48)) {
            lt._4_4_ = *(int *)(p + 0xbc);
          }
        }
        else {
          *(int *)(p + 0xbc) = (int)*(undefined8 *)(*(long *)(p + 0x18) + 0x48);
        }
        if (0xf0 < (int)(dot._4_4_ + *(int *)(p + 0xbc))) {
          pcVar5 = archive_entry_pathname(*(archive_entry **)(*(long *)(p + 0x18) + 0x20));
          archive_set_error(&a->archive,-1,
                            "The regulation of Joliet extensions; A length of a full-pathname of `%s\' is longer than 240 bytes, (p=%d, b=%d)"
                            ,pcVar5,(ulong)dot._4_4_,(ulong)*(uint *)(p + 0xbc));
          return -0x1e;
        }
        if (iVar2 == local_50) {
          local_68 = local_68 + -6;
        }
        else if (iVar2 == local_50 + -2) {
          local_68 = local_68 + -4;
        }
        else if (iVar2 == local_50 + -4) {
          local_68 = local_68 + -2;
        }
        idr_register(idr,(isoent *)p,lt._4_4_,local_68);
      }
      idr_resolve(idr,idr_set_num_beutf16);
      a_local._4_4_ = 0;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
isoent_gen_joliet_identifier(struct archive_write *a, struct isoent *isoent,
    struct idr *idr)
{
	struct iso9660 *iso9660;
	struct isoent *np;
	unsigned char *p;
	size_t l;
	int r;
	int ffmax, parent_len;
	static const struct archive_rb_tree_ops rb_ops = {
		isoent_cmp_node_joliet, isoent_cmp_key_joliet
	};

	if (isoent->children.cnt == 0)
		return (0);

	iso9660 = a->format_data;
	if (iso9660->opt.joliet == OPT_JOLIET_LONGNAME)
		ffmax = 206;
	else
		ffmax = 128;

	r = idr_start(a, idr, isoent->children.cnt, ffmax, 6, 2, &rb_ops);
	if (r < 0)
		return (r);

	parent_len = 1;
	for (np = isoent; np->parent != np; np = np->parent)
		parent_len += np->mb_len + 1;

	for (np = isoent->children.first; np != NULL; np = np->chnext) {
		unsigned char *dot;
		int ext_off, noff, weight;
		size_t lt;

		if ((int)(l = np->file->basename_utf16.length) > ffmax)
			l = ffmax;

		p = malloc((l+1)*2);
		if (p == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory");
			return (ARCHIVE_FATAL);
		}
		memcpy(p, np->file->basename_utf16.s, l);
		p[l] = 0;
		p[l+1] = 0;

		np->identifier = (char *)p;
		lt = l;
		dot = p + l;
		weight = 0;
		while (lt > 0) {
			if (!joliet_allowed_char(p[0], p[1]))
				archive_be16enc(p, 0x005F); /* '_' */
			else if (p[0] == 0 && p[1] == 0x2E) /* '.' */
				dot = p;
			p += 2;
			lt -= 2;
		}
		ext_off = (int)(dot - (unsigned char *)np->identifier);
		np->ext_off = ext_off;
		np->ext_len = (int)l - ext_off;
		np->id_len = (int)l;

		/*
		 * Get a length of MBS of a full-pathname.
		 */
		if ((int)np->file->basename_utf16.length > ffmax) {
			if (archive_strncpy_l(&iso9660->mbs,
			    (const char *)np->identifier, l,
				iso9660->sconv_from_utf16be) != 0 &&
			    errno == ENOMEM) {
				archive_set_error(&a->archive, errno,
				    "No memory");
				return (ARCHIVE_FATAL);
			}
			np->mb_len = (int)iso9660->mbs.length;
			if (np->mb_len != (int)np->file->basename.length)
				weight = np->mb_len;
		} else
			np->mb_len = (int)np->file->basename.length;

		/* If a length of full-pathname is longer than 240 bytes,
		 * it violates Joliet extensions regulation. */
		if (parent_len + np->mb_len > 240) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "The regulation of Joliet extensions;"
			    " A length of a full-pathname of `%s' is "
			    "longer than 240 bytes, (p=%d, b=%d)",
			    archive_entry_pathname(np->file->entry),
			    (int)parent_len, (int)np->mb_len);
			return (ARCHIVE_FATAL);
		}

		/* Make an offset of the number which is used to be set
		 * hexadecimal number to avoid duplicate identifier. */
		if ((int)l == ffmax)
			noff = ext_off - 6;
		else if ((int)l == ffmax-2)
			noff = ext_off - 4;
		else if ((int)l == ffmax-4)
			noff = ext_off - 2;
		else
			noff = ext_off;
		/* Register entry to the identifier resolver. */
		idr_register(idr, np, weight, noff);
	}

	/* Resolve duplicate identifier with Joliet Volume. */
	idr_resolve(idr, idr_set_num_beutf16);

	return (ARCHIVE_OK);
}